

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O1

string * __thiscall
absl::internal::(anonymous_namespace)::PrintHelp_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char *programname)

{
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char *pcVar3;
  string *psVar4;
  size_t sVar5;
  FlagList *pFVar6;
  ostream *poVar7;
  pointer psVar8;
  ostringstream os;
  undefined1 auStack_1b8 [7];
  char local_1b1;
  string *local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"sentencepiece",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Usage: ",7);
  if (this == (_anonymous_namespace_ *)0x0) {
    std::ios::clear((int)auStack_1b8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x10);
  }
  else {
    sVar5 = strlen((char *)this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)this,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8," [options] files\n\n",0x12);
  local_1b0 = __return_storage_ptr__;
  pFVar6 = anon_unknown_1::GetFlagList();
  psVar8 = (pFVar6->
           super__Vector_base<std::shared_ptr<absl::internal::FlagFunc>,_std::allocator<std::shared_ptr<absl::internal::FlagFunc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (pFVar6->
           super__Vector_base<std::shared_ptr<absl::internal::FlagFunc>,_std::allocator<std::shared_ptr<absl::internal::FlagFunc>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar8 != psVar1) {
    do {
      peVar2 = (psVar8->super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      this_00 = (psVar8->super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"   --",5);
      pcVar3 = peVar2->name;
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)auStack_1b8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x10);
      }
      else {
        sVar5 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," (",2);
      pcVar3 = peVar2->help;
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)auStack_1b8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x10);
      }
      else {
        sVar5 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  type: ",8);
      pcVar3 = peVar2->type;
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)auStack_1b8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x10);
      }
      else {
        sVar5 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," default: ",10);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(peVar2->default_value)._M_dataplus._M_p,
                          (peVar2->default_value)._M_string_length);
      local_1b1 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_1b1,1);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      psVar8 = psVar8 + 1;
    } while (psVar8 != psVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n\n",2);
  psVar4 = local_1b0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string PrintHelp(const char *programname) {
  std::ostringstream os;
  os << PACKAGE_STRING << "\n\n";
  os << "Usage: " << programname << " [options] files\n\n";

  for (auto func : *GetFlagList()) {
    os << "   --" << func->name << " (" << func->help << ")";
    os << "  type: " << func->type << " default: " << func->default_value
       << '\n';
  }

  os << "\n\n";

  return os.str();
}